

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O0

void __thiscall QTuioHandler::process2DObjFseq(QTuioHandler *this,QOscMessage *message)

{
  bool bVar1;
  QWindow *win_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  const_iterator o;
  QTuioToken *in_RSI;
  QTuioHandler *in_RDI;
  long in_FS_OFFSET;
  QTuioToken *t_1;
  add_const_t<QList<QTuioToken>_> *__range1_1;
  QTuioToken *t;
  add_const_t<QMap<int,_QTuioToken>_> *__range1;
  QWindow *win;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QWindowSystemInterface::TouchPoint> tpl;
  TouchPoint tp_1;
  TouchPoint tp;
  parameter_type in_stack_fffffffffffffe18;
  QList<QWindowSystemInterface::TouchPoint> *in_stack_fffffffffffffe20;
  QPointingDevice *this_00;
  undefined7 in_stack_fffffffffffffe30;
  byte local_1b9;
  QList<QWindowSystemInterface::TouchPoint> *in_stack_fffffffffffffe48;
  QTuioHandler *this_01;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  const_iterator local_160;
  const_iterator local_158;
  const_iterator local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  QList<QWindow_*> local_118;
  QVector2D local_100;
  undefined1 local_f8 [80];
  undefined1 local_a8;
  float local_a4 [2];
  undefined1 local_80 [120];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  win_00 = (QWindow *)QGuiApplication::focusWindow();
  bVar1 = false;
  local_1b9 = 0;
  if (win_00 == (QWindow *)0x0) {
    QGuiApplication::topLevelWindows();
    bVar1 = true;
    qVar2 = QList<QWindow_*>::size(&local_118);
    local_1b9 = 0;
    if (0 < qVar2) {
      local_1b9 = forceDelivery;
    }
  }
  if (bVar1) {
    QList<QWindow_*>::~QList((QList<QWindow_*> *)0x112906);
  }
  if ((local_1b9 & 1) != 0) {
    QGuiApplication::topLevelWindows();
    ppQVar3 = QList<QWindow_*>::at
                        ((QList<QWindow_*> *)in_stack_fffffffffffffe20,
                         (qsizetype)in_stack_fffffffffffffe18);
    win_00 = *ppQVar3;
    QList<QWindow_*>::~QList((QList<QWindow_*> *)0x112943);
  }
  if (win_00 != (QWindow *)0x0) {
    local_148 = 0xaaaaaaaaaaaaaaaa;
    local_140 = 0xaaaaaaaaaaaaaaaa;
    local_138 = 0xaaaaaaaaaaaaaaaa;
    QList<QWindowSystemInterface::TouchPoint>::QList
              ((QList<QWindowSystemInterface::TouchPoint> *)0x11298a);
    QMap<int,_QTuioToken>::size((QMap<int,_QTuioToken> *)in_stack_fffffffffffffe20);
    QList<QTuioToken>::size(&in_RDI->m_deadTokens);
    QList<QWindowSystemInterface::TouchPoint>::reserve
              (in_stack_fffffffffffffe48,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_150._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_150._M_node =
         (_Base_ptr)
         QMap<int,_QTuioToken>::begin
                   ((QMap<int,_QTuioToken> *)CONCAT17(local_1b9,in_stack_fffffffffffffe30));
    local_158._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_158._M_node =
         (_Base_ptr)
         QMap<int,_QTuioToken>::end
                   ((QMap<int,_QTuioToken> *)CONCAT17(local_1b9,in_stack_fffffffffffffe30));
    while (bVar1 = operator!=((const_iterator *)in_stack_fffffffffffffe20,
                              (const_iterator *)in_stack_fffffffffffffe18), bVar1) {
      QMap<int,_QTuioToken>::const_iterator::operator*((const_iterator *)0x112a59);
      memcpy(local_80,&DAT_001288f8,0x78);
      tokenToTouchPoint(this_01,in_RSI,win_00);
      QList<QWindowSystemInterface::TouchPoint>::append
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      QWindowSystemInterface::TouchPoint::~TouchPoint((TouchPoint *)0x112ab5);
      QMap<int,_QTuioToken>::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe20)
      ;
    }
    local_160.i = (QTuioToken *)0xaaaaaaaaaaaaaaaa;
    local_160 = QList<QTuioToken>::begin((QList<QTuioToken> *)in_stack_fffffffffffffe20);
    o = QList<QTuioToken>::end((QList<QTuioToken> *)in_stack_fffffffffffffe20);
    while (bVar1 = QList<QTuioToken>::const_iterator::operator!=(&local_160,o), bVar1) {
      QList<QTuioToken>::const_iterator::operator*(&local_160);
      memcpy(local_f8,&DAT_00128970,0x78);
      tokenToTouchPoint(this_01,in_RSI,win_00);
      local_a8 = 8;
      QVector2D::QVector2D(&local_100);
      local_a4[0] = local_100.v[0];
      local_a4[1] = local_100.v[1];
      QList<QWindowSystemInterface::TouchPoint>::append
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      QWindowSystemInterface::TouchPoint::~TouchPoint((TouchPoint *)0x112beb);
      QList<QTuioToken>::const_iterator::operator++(&local_160);
    }
    this_00 = in_RDI->m_device;
    QFlags<Qt::KeyboardModifier>::QFlags
              ((QFlags<Qt::KeyboardModifier> *)this_00,(KeyboardModifier)((ulong)win_00 >> 0x20));
    QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::DefaultDelivery>
              (win_00,this_00,(QList_conflict *)&local_148,
               (QFlags *)(ulong)in_stack_fffffffffffffe8c);
    QList<QTuioToken>::clear((QList<QTuioToken> *)this_00);
    QList<QWindowSystemInterface::TouchPoint>::~QList
              ((QList<QWindowSystemInterface::TouchPoint> *)0x112c55);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTuioHandler::process2DObjFseq(const QOscMessage &message)
{
    Q_UNUSED(message); // TODO: do we need to do anything with the frame id?

    QWindow *win = QGuiApplication::focusWindow();
    if (!win && QGuiApplication::topLevelWindows().size() > 0 && forceDelivery)
          win = QGuiApplication::topLevelWindows().at(0);

    if (!win)
        return;

    QList<QWindowSystemInterface::TouchPoint> tpl;
    tpl.reserve(m_activeTokens.size() + m_deadTokens.size());

    for (const QTuioToken & t : std::as_const(m_activeTokens)) {
        QWindowSystemInterface::TouchPoint tp = tokenToTouchPoint(t, win);
        tpl.append(tp);
    }

    for (const QTuioToken & t : std::as_const(m_deadTokens)) {
        QWindowSystemInterface::TouchPoint tp = tokenToTouchPoint(t, win);
        tp.state = QEventPoint::State::Released;
        tp.velocity = QVector2D();
        tpl.append(tp);
    }
    QWindowSystemInterface::handleTouchEvent(win, m_device, tpl);

    m_deadTokens.clear();
}